

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  uint uVar8;
  ImU32 IVar9;
  GetterXsYs<unsigned_int> *pGVar10;
  TransformerLogLog *pTVar11;
  ImPlotPlot *pIVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  ImPlotContext *pIVar15;
  ImDrawIdx IVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  pIVar15 = GImPlot;
  pGVar10 = this->Getter;
  pTVar11 = this->Transformer;
  iVar7 = pGVar10->Count;
  lVar17 = (long)(((pGVar10->Offset + prim + 1) % iVar7 + iVar7) % iVar7) * (long)pGVar10->Stride;
  uVar8 = *(uint *)((long)pGVar10->Ys + lVar17);
  dVar20 = log10((double)*(uint *)((long)pGVar10->Xs + lVar17) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar15->LogDenX;
  pIVar12 = pIVar15->CurrentPlot;
  dVar3 = (pIVar12->XAxis).Range.Min;
  dVar4 = (pIVar12->XAxis).Range.Max;
  dVar21 = log10((double)uVar8 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  iVar7 = pTVar11->YAxis;
  pIVar12 = pIVar15->CurrentPlot;
  dVar5 = pIVar12->YAxis[iVar7].Range.Min;
  fVar24 = (float)((((double)(float)(dVar20 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar12->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar7].Min.x);
  fVar25 = (float)((((double)(float)(dVar21 / pIVar15->LogDenY[iVar7]) *
                     (pIVar12->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar15->My[iVar7] + (double)pIVar15->PixelRange[iVar7].Min.y);
  fVar23 = (this->P1).x;
  fVar26 = (this->P1).y;
  fVar22 = fVar26;
  if (fVar25 <= fVar26) {
    fVar22 = fVar25;
  }
  bVar18 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar22 = (float)(-(uint)(fVar25 <= fVar26) & (uint)fVar26 |
                      ~-(uint)(fVar25 <= fVar26) & (uint)fVar25), pfVar1 = &(cull_rect->Min).y,
     bVar18 = false, *pfVar1 <= fVar22 && fVar22 != *pfVar1)) {
    fVar22 = fVar23;
    if (fVar24 <= fVar23) {
      fVar22 = fVar24;
    }
    if (fVar22 < (cull_rect->Max).x) {
      fVar22 = (float)(~-(uint)(fVar24 <= fVar23) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar23) & (uint)fVar23);
      bVar18 = (cull_rect->Min).x <= fVar22 && fVar22 != (cull_rect->Min).x;
    }
  }
  if (bVar18 != false) {
    fVar22 = this->Weight;
    IVar9 = this->Col;
    IVar6 = *uv;
    fVar23 = fVar24 - fVar23;
    fVar26 = fVar25 - fVar26;
    fVar19 = fVar23 * fVar23 + fVar26 * fVar26;
    if (0.0 < fVar19) {
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      fVar23 = fVar23 * (1.0 / fVar19);
      fVar26 = fVar26 * (1.0 / fVar19);
    }
    fVar22 = fVar22 * 0.5;
    fVar23 = fVar23 * fVar22;
    fVar22 = fVar22 * fVar26;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = (this->P1).x + fVar22;
    (pIVar13->pos).y = (this->P1).y - fVar23;
    pIVar13->uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar9;
    pIVar13[1].pos.x = fVar22 + fVar24;
    pIVar13[1].pos.y = fVar25 - fVar23;
    pIVar13[1].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar9;
    pIVar13[2].pos.x = fVar24 - fVar22;
    pIVar13[2].pos.y = fVar23 + fVar25;
    pIVar13[2].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar9;
    pIVar13[3].pos.x = (this->P1).x - fVar22;
    pIVar13[3].pos.y = fVar23 + (this->P1).y;
    pIVar13[3].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar8;
    *pIVar14 = IVar16;
    pIVar14[1] = IVar16 + 1;
    pIVar14[2] = IVar16 + 2;
    pIVar14[3] = IVar16;
    pIVar14[4] = IVar16 + 2;
    pIVar14[5] = IVar16 + 3;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  IVar6.y = fVar25;
  IVar6.x = fVar24;
  this->P1 = IVar6;
  return bVar18;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }